

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O1

Vars * __thiscall
google::protobuf::compiler::cpp::FieldGenerator::PushVarsForCall
          (Vars *__return_storage_ptr__,FieldGenerator *this,Printer *p)

{
  pointer pSVar1;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  
  pSVar1 = (this->field_vars_).
           super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           ._M_impl.super__Vector_impl_data._M_start;
  vars.len_ = ((long)(this->field_vars_).
                     super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
              -0x2c8590b21642c859;
  vars.ptr_ = pSVar1;
  io::Printer::WithDefs(&__return_storage_ptr__->cleanup1,p,vars,false);
  pSVar1 = (this->tracker_vars_).
           super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           ._M_impl.super__Vector_impl_data._M_start;
  vars_00.len_ = ((long)(this->tracker_vars_).
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
                 -0x2c8590b21642c859;
  vars_00.ptr_ = pSVar1;
  io::Printer::WithDefs(&__return_storage_ptr__->cleanup2,p,vars_00,false);
  pSVar1 = (this->per_generator_vars_).
           super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           ._M_impl.super__Vector_impl_data._M_start;
  vars_01.len_ = ((long)(this->per_generator_vars_).
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
                 -0x2c8590b21642c859;
  vars_01.ptr_ = pSVar1;
  io::Printer::WithDefs(&__return_storage_ptr__->cleanup3,p,vars_01,false);
  return __return_storage_ptr__;
}

Assistant:

auto PushVarsForCall(io::Printer* p) const {
    // NOTE: we use a struct here because:
    // * We want to ensure that order of evaluation below is well-defined,
    //   which {...} guarantees but (...) does not.
    // * We do not require C++17 as of writing and therefore cannot use
    //   std::tuple with CTAD.
    // * std::make_tuple uses (...), not {...}.
    struct Vars {
      decltype(p->WithVars(field_vars_)) cleanup1;
      decltype(p->WithVars(tracker_vars_)) cleanup2;
      decltype(p->WithVars(per_generator_vars_)) cleanup3;
    };

    return Vars{p->WithVars(field_vars_), p->WithVars(tracker_vars_),
                p->WithVars(per_generator_vars_)};
  }